

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O3

int archive_write_mtree_finish_entry(archive_write *a)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  uint *puVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  
  plVar2 = (long *)a->format_data;
  lVar3 = *plVar2;
  if (lVar3 != 0) {
    *plVar2 = 0;
    puVar4 = *(uint **)(lVar3 + 0x30);
    if (puVar4 != (uint *)0x0) {
      uVar1 = *(uint *)(plVar2 + 0x1c);
      if ((uVar1 & 1) != 0) {
        uVar7 = plVar2[0x1d];
        uVar6 = *(uint *)((long)plVar2 + 0xe4);
        if (uVar7 != 0) {
          do {
            uVar6 = uVar6 << 8 ^ crctab[(uint)uVar7 & 0xff ^ uVar6 >> 0x18];
            bVar5 = 0xff < uVar7;
            uVar7 = uVar7 >> 8;
          } while (bVar5);
          *(uint *)((long)plVar2 + 0xe4) = uVar6;
        }
        puVar4[1] = ~uVar6;
      }
      *puVar4 = uVar1;
    }
  }
  return 0;
}

Assistant:

static int
archive_write_mtree_finish_entry(struct archive_write *a)
{
	struct mtree_writer *mtree = a->format_data;
	struct mtree_entry *me;

	if ((me = mtree->mtree_entry) == NULL)
		return (ARCHIVE_OK);
	mtree->mtree_entry = NULL;

	if (me->reg_info)
		sum_final(mtree, me->reg_info);

	return (ARCHIVE_OK);
}